

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nim.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  bool bVar2;
  Move move;
  ostream *poVar3;
  ComputeOptions *pCVar4;
  char *pcVar5;
  NimState state;
  ComputeOptions local_60;
  ComputeOptions local_48;
  
  state.player_to_move = 1;
  state.chips = 0xf;
  while( true ) {
    bVar2 = NimState::has_moves(&state);
    if (!bVar2) break;
    poVar3 = std::operator<<((ostream *)&std::cout,"State: ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,state.player_to_move);
    std::endl<char,std::char_traits<char>>(poVar3);
    if (state.player_to_move == 1) {
      local_48.number_of_threads = 8;
      local_48.max_iterations = 100000;
      pCVar4 = &local_48;
    }
    else {
      local_60.number_of_threads = 8;
      local_60.max_iterations = 10000;
      pCVar4 = &local_60;
    }
    pCVar4->max_time = -1.0;
    pCVar4->verbose = true;
    move = MCTS::compute_move<NimState>(state,*pCVar4);
    poVar3 = std::operator<<((ostream *)&std::cout,"Best move: ");
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,move);
    std::endl<char,std::char_traits<char>>(poVar3);
    NimState::do_move(&state,move);
  }
  dVar1 = NimState::get_result(&state,2);
  if ((dVar1 != 1.0) || (NAN(dVar1))) {
    dVar1 = NimState::get_result(&state,1);
    pcVar5 = "Player 2 wins!";
    if (dVar1 != 1.0) {
      pcVar5 = "Nobody wins!";
    }
    if (NAN(dVar1)) {
      pcVar5 = "Nobody wins!";
    }
  }
  else {
    pcVar5 = "Player 1 wins!";
  }
  poVar3 = std::operator<<((ostream *)&std::cout,pcVar5);
  std::endl<char,std::char_traits<char>>(poVar3);
  return 0;
}

Assistant:

int main()
{
	using namespace std;

	MCTS::ComputeOptions player1_options, player2_options;
	player1_options.max_iterations = 100000;
	player1_options.verbose = true;
	player2_options.max_iterations =  10000;
	player2_options.verbose = true;

	NimState state(15);
	while (state.has_moves()) {
		cout << "State: " << state.player_to_move << endl;
		NimState::Move move;
		if (state.player_to_move == 1) {
			move = MCTS::compute_move(state, player1_options);
		}
		else {
			move = MCTS::compute_move(state, player2_options);
		}

		cout << "Best move: " << move << endl;
		state.do_move(move);
	}
	if (state.get_result(2) == 1.0) {
		cout << "Player 1 wins!" << endl;
	}
	else if (state.get_result(1) == 1.0) {
		cout << "Player 2 wins!" << endl;
	}
	else {
		cout << "Nobody wins!" << endl;
	}
}